

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O2

void Extra_BitMatrixPrint(Extra_BitMat_t *pMat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int i;
  
  putchar(10);
  iVar1 = pMat->nSize;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  iVar4 = 1;
  i = 0;
  while (iVar5 = iVar4, i != iVar2) {
    while (iVar5 != 0) {
      putchar(0x20);
      iVar5 = iVar5 + -1;
    }
    for (iVar5 = i + 1; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      iVar3 = Extra_BitMatrixLookup1(pMat,i,iVar5);
      putchar((uint)(iVar3 != 0) * 3 + 0x2e);
    }
    putchar(10);
    iVar4 = iVar4 + 1;
    i = i + 1;
  }
  return;
}

Assistant:

void Extra_BitMatrixPrint( Extra_BitMat_t * pMat )
{
    int i, k, nVars;
    printf( "\n" );
    nVars = Extra_BitMatrixReadSize( pMat );
    for ( i = 0; i < nVars; i++ )
    {
        for ( k = 0; k <= i; k++ )
            printf( " " );
        for ( k = i+1; k < nVars; k++ )
            if ( Extra_BitMatrixLookup1( pMat, i, k ) )
                printf( "1" );
            else
                printf( "." );
        printf( "\n" );
    }
}